

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlStringLenGetNodeList(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_58;
  undefined4 local_4c;
  undefined8 uStack_48;
  int len;
  xmlChar *value;
  PyObject *pyobj_doc;
  xmlDoc *doc;
  xmlNodePtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"Ozi:xmlStringLenGetNodeList",&value,&stack0xffffffffffffffb8,&local_4c);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (value == &_Py_NoneStruct) {
      local_58 = (PyObject *)0x0;
    }
    else {
      local_58 = *(PyObject **)(value + 0x10);
    }
    pyobj_doc = local_58;
    doc = (xmlDoc *)xmlStringLenGetNodeList(local_58,uStack_48,local_4c);
    self_local = libxml_xmlNodePtrWrap((xmlNodePtr)doc);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlStringLenGetNodeList(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlNodePtr c_retval;
    xmlDoc * doc;
    PyObject *pyobj_doc;
    xmlChar * value;
    int len;

    if (!PyArg_ParseTuple(args, (char *)"Ozi:xmlStringLenGetNodeList", &pyobj_doc, &value, &len))
        return(NULL);
    doc = (xmlDoc *) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlStringLenGetNodeList(doc, value, len);
    py_retval = libxml_xmlNodePtrWrap((xmlNodePtr) c_retval);
    return(py_retval);
}